

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_test.cc
# Opt level: O0

void __thiscall
leveldb::EnvTest_TestOpenNonExistentFile_Test::~EnvTest_TestOpenNonExistentFile_Test
          (EnvTest_TestOpenNonExistentFile_Test *this)

{
  EnvTest_TestOpenNonExistentFile_Test *this_local;
  
  ~EnvTest_TestOpenNonExistentFile_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(EnvTest, TestOpenNonExistentFile) {
  // Write some test data to a single file that will be opened |n| times.
  std::string test_dir;
  ASSERT_LEVELDB_OK(env_->GetTestDirectory(&test_dir));

  std::string non_existent_file = test_dir + "/non_existent_file";
  ASSERT_TRUE(!env_->FileExists(non_existent_file));

  RandomAccessFile* random_access_file;
  Status status =
      env_->NewRandomAccessFile(non_existent_file, &random_access_file);
  ASSERT_TRUE(status.IsNotFound());

  SequentialFile* sequential_file;
  status = env_->NewSequentialFile(non_existent_file, &sequential_file);
  ASSERT_TRUE(status.IsNotFound());
}